

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_restore(DisasContext_conflict6 *ctx,uint8_t rt,uint8_t count,uint8_t gp,uint16_t u)

{
  TCGContext_conflict6 *s;
  uint uVar1;
  uint uVar2;
  TCGTemp *pTVar3;
  TCGv_i64 addr;
  TCGv_i64 val;
  undefined7 in_register_00000011;
  uint offset;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = CONCAT71(in_register_00000011,count) & 0xffffffff;
  s = ctx->uc->tcg_ctx;
  pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  addr = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  val = (TCGv_i64)((long)pTVar3 - (long)s);
  if ((int)CONCAT71(in_register_00000011,count) != 0) {
    uVar4 = (uint)rt;
    uVar1 = uVar4 & 0x10;
    offset = (uint)u;
    do {
      offset = offset - 4;
      uVar2 = uVar4 & 0x1f | uVar1;
      uVar5 = uVar2;
      if ((int)uVar6 == 1) {
        uVar5 = 0x1c;
      }
      if (gp == '\0') {
        uVar5 = uVar2;
      }
      gen_base_offset_addr(ctx,addr,0x1d,offset);
      tcg_gen_qemu_ld_i64_mips64el
                (s,val,addr,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_LESL);
      tcg_gen_ext32s_i64_mips64el(s,val,val);
      if ((uVar5 != 0) && (s->cpu_gpr[uVar5] != val)) {
        tcg_gen_op2_mips64el
                  (s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[uVar5] + (long)s),(TCGArg)pTVar3);
      }
      uVar4 = uVar4 + 1;
      uVar5 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != 0);
  }
  gen_adjust_sp(ctx,(uint)u);
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(val + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(addr + (long)s));
  return;
}

Assistant:

static void gen_restore(DisasContext *ctx, uint8_t rt, uint8_t count,
                        uint8_t gp, uint16_t u)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int counter = 0;
    TCGv va = tcg_temp_new(tcg_ctx);
    TCGv t0 = tcg_temp_new(tcg_ctx);

    while (counter != count) {
        bool use_gp = gp && (counter == count - 1);
        int this_rt = use_gp ? 28 : (rt & 0x10) | ((rt + counter) & 0x1f);
        int this_offset = u - ((counter + 1) << 2);
        gen_base_offset_addr(ctx, va, 29, this_offset);
        tcg_gen_qemu_ld_tl(tcg_ctx, t0, va, ctx->mem_idx, MO_TESL |
                        ctx->default_tcg_memop_mask);
        tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
        gen_store_gpr(tcg_ctx, t0, this_rt);
        counter++;
    }

    /* adjust stack pointer */
    gen_adjust_sp(ctx, u);

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, va);
}